

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::expected::expected(expected *this,location *where_,text *expr_,text *excpt_)

{
  allocator local_d1;
  text local_d0;
  text local_b0;
  text local_90;
  location local_70;
  string local_48 [32];
  
  std::__cxx11::string::string(local_48,"failed: didn\'t get exception",&local_d1);
  std::__cxx11::string::string((string *)&local_90,local_48);
  location::location(&local_70,where_);
  std::__cxx11::string::string((string *)&local_b0,(string *)expr_);
  std::__cxx11::string::string((string *)&local_d0,(string *)excpt_);
  message::message(&this->super_message,&local_90,&local_70,&local_b0,&local_d0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  *(undefined ***)&this->super_message = &PTR__message_00165d88;
  return;
}

Assistant:

expected( location where_, text expr_, text excpt_ = "" )
    : message( "failed: didn't get exception", where_, expr_, excpt_) {}